

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata160.cpp
# Opt level: O0

void __thiscall
ByteData160_EqualsMatch_Test::~ByteData160_EqualsMatch_Test(ByteData160_EqualsMatch_Test *this)

{
  ByteData160_EqualsMatch_Test *this_local;
  
  ~ByteData160_EqualsMatch_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData160, EqualsMatch) {
  ByteData160 byte_data1 = ByteData160(
      "1234567890123456789012345678901234567890");
  ByteData160 byte_data2 = ByteData160(
      "1234567890123456789012345678901234567890");
  bool is_equals = byte_data1.Equals(byte_data2);

  EXPECT_TRUE(is_equals);
}